

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O0

bool __thiscall
MC::MC_Driver::addColunm(MC_Driver *this,string *colunmName,int attributype,int constraint)

{
  bool bVar1;
  ostream *poVar2;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_&>::value,_pair<iterator,_bool>_>
  _Var3;
  undefined1 local_a8 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p_1;
  undefined1 local_60 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  _Self local_30;
  iterator it;
  int constraint_local;
  int attributype_local;
  string *colunmName_local;
  MC_Driver *this_local;
  
  it._M_node._0_4_ = constraint;
  it._M_node._4_4_ = attributype;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->tableInfo->getID,colunmName);
  p._32_8_ = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end(&this->tableInfo->getID);
  bVar1 = std::operator!=(&local_30,(_Self *)&p.second);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"duplicate colunm ");
    poVar2 = std::operator<<(poVar2,(string *)colunmName);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else if (this->tableInfo->attributeNum < 0x20) {
    if (((it._M_node._4_4_ == 50000) || (it._M_node._4_4_ == 90000)) || (120000 < it._M_node._4_4_))
    {
      if (it._M_node._4_4_ + -120000 < 0x100) {
        if ((((int)it._M_node == 0) || ((int)it._M_node == 1)) ||
           (((int)it._M_node == 2 || ((int)it._M_node == 3)))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->tableInfo->attributeName,colunmName);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->tableInfo->type,(value_type_conflict *)((long)&it._M_node + 4));
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->tableInfo->constraint,(value_type_conflict *)&it);
          std::make_pair<std::__cxx11::string&,int&>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)local_60,colunmName,&this->tableInfo->attributeNum);
          _Var3 = std::
                  map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  ::insert<std::pair<std::__cxx11::string,int>&>
                            ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                              *)&this->tableInfo->getID,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                              *)local_60);
          p_1._32_8_ = _Var3.first._M_node;
          if ((int)it._M_node == 3) {
            this->tableInfo->primary_key_id = this->tableInfo->attributeNum;
            std::make_pair<int&,std::__cxx11::string&>
                      ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_a8,&this->tableInfo->attributeNum,colunmName);
            std::
            map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
            ::insert<std::pair<int,std::__cxx11::string>&>
                      ((map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                        *)&this->tableInfo->indexInfo,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_a8);
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_a8);
          }
          this->tableInfo->attributeNum = this->tableInfo->attributeNum + 1;
          this_local._7_1_ = true;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                   *)local_60);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"attribute constraint of ");
          poVar2 = std::operator<<(poVar2,(string *)colunmName);
          std::operator<<(poVar2," unrecognized\n");
          this_local._7_1_ = false;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "length of char type can not be longer than 255");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"attributetype of ");
      poVar2 = std::operator<<(poVar2,(string *)colunmName);
      std::operator<<(poVar2," unrecognized\n");
      this_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"exceed maximum number of attribute\n");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MC::MC_Driver::addColunm(std::string colunmName,int attributype,int constraint){
    //是否重名
    auto it = tableInfo->getID.find(colunmName);
    if(it!=tableInfo->getID.end()){
        std::cout<<"duplicate colunm "<<colunmName<<std::endl;
        return false;
    }
    //是否超过最大属性数目
    if(tableInfo->attributeNum >= 32){
        std::cout<<"exceed maximum number of attribute\n";
        return false;
    }
    
    //检查类型是否没有错误
    if(attributype == 50000 || attributype == 90000 || attributype > 120000){
        if(attributype - 120000 > 255){
            //长度太长
            std::cout<<"length of char type can not be longer than 255"<<std::endl;
            return false;
        }
        //检查属性限制是否错误
        //0代表没有限制 1代表not null 2代表unique 3代表primary key
        if(constraint == 0 || constraint == 1 || constraint == 2 || constraint == 3){
            //类型和限制都没有错误
            tableInfo->attributeName.push_back(colunmName);
            tableInfo->type.push_back(attributype);
            tableInfo->constraint.push_back(constraint);
            std::pair<std::string,int> p = std::make_pair(colunmName,tableInfo->attributeNum);
            tableInfo->getID.insert(p);
            //如果是primary key需要加上它建立在的列的id
            if(constraint == 3){
                tableInfo->primary_key_id =  tableInfo->attributeNum;
                std::pair<int,std::string> p = std::make_pair(tableInfo->attributeNum, colunmName);
                tableInfo->indexInfo.insert(p);
            }
            tableInfo->attributeNum++;
            return true;
        }
        else{
            std::cout << "attribute constraint of " <<colunmName<<" unrecognized\n";
            return false;
        }
        //tableInfo->type_and_constraint.
    }else{
        //输入类型错误
        std::cout << "attributetype of " <<colunmName<<" unrecognized\n";
        return false;
    }
}